

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O1

cl_int clCommandFillImageKHR
                 (cl_command_buffer_khr command_buffer,cl_command_queue command_queue,
                 cl_command_properties_khr *properties,cl_mem image,void *fill_color,size_t *origin,
                 size_t *region,cl_uint num_sync_points_in_wait_list,
                 cl_sync_point_khr *sync_point_wait_list,cl_sync_point_khr *sync_point,
                 cl_mutable_command_khr *mutable_handle)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  ulong enqueueCounter;
  CLIntercept *pIntercept;
  uint errorCode;
  _Base_ptr p_Var3;
  mapped_type *pmVar4;
  time_point end;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  time_point local_a0;
  string local_98;
  cl_command_queue local_78;
  _func_cl_int_cl_command_buffer_khr_cl_command_queue_cl_command_properties_khr_ptr_cl_mem_void_ptr_size_t_ptr_size_t_ptr_cl_uint_cl_sync_point_khr_ptr_cl_sync_point_khr_ptr_cl_mutable_command_khr_ptr
  *local_70;
  void *local_68;
  size_t *local_60;
  cl_command_properties_khr *local_58;
  string syncPointWaitList;
  
  pIntercept = g_pIntercept;
  if (g_pIntercept == (CLIntercept *)0x0) {
    return -0x472;
  }
  p_Var1 = &(g_pIntercept->m_CommandBufferInfoMap)._M_t._M_impl.super__Rb_tree_header;
  p_Var3 = (g_pIntercept->m_CommandBufferInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header.
           _M_parent;
  p_Var5 = &p_Var1->_M_header;
  for (; p_Var3 != (_Base_ptr)0x0;
      p_Var3 = (&p_Var3->_M_left)[*(cl_command_buffer_khr *)(p_Var3 + 1) < command_buffer]) {
    if (*(cl_command_buffer_khr *)(p_Var3 + 1) >= command_buffer) {
      p_Var5 = p_Var3;
    }
  }
  p_Var3 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
     (p_Var3 = p_Var5, command_buffer < *(cl_command_buffer_khr *)(p_Var5 + 1))) {
    p_Var3 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var3 == p_Var1) {
    p_Var3 = (_Base_ptr)0x0;
  }
  else {
    p_Var3 = p_Var3[1]._M_parent;
  }
  p_Var1 = &(g_pIntercept->m_DispatchX)._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = (g_pIntercept->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var6 = &p_Var1->_M_header;
  for (; p_Var5 != (_Base_ptr)0x0; p_Var5 = (&p_Var5->_M_left)[*(_Base_ptr *)(p_Var5 + 1) < p_Var3])
  {
    if (*(_Base_ptr *)(p_Var5 + 1) >= p_Var3) {
      p_Var6 = p_Var5;
    }
  }
  p_Var5 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
     (p_Var5 = p_Var6, p_Var3 < *(_Base_ptr *)(p_Var6 + 1))) {
    p_Var5 = &p_Var1->_M_header;
  }
  local_78 = command_queue;
  local_58 = properties;
  if ((_Rb_tree_header *)p_Var5 == p_Var1) {
    syncPointWaitList._M_dataplus._M_p = (pointer)0x0;
    pmVar4 = std::
             map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
             ::at(&g_pIntercept->m_DispatchX,(key_type *)&syncPointWaitList);
  }
  else {
    pmVar4 = (mapped_type *)&p_Var5[1]._M_parent;
  }
  local_70 = pmVar4->clCommandFillImageKHR;
  if (local_70 ==
      (_func_cl_int_cl_command_buffer_khr_cl_command_queue_cl_command_properties_khr_ptr_cl_mem_void_ptr_size_t_ptr_size_t_ptr_cl_uint_cl_sync_point_khr_ptr_cl_sync_point_khr_ptr_cl_mutable_command_khr_ptr
       *)0x0) goto LAB_00142cf2;
  enqueueCounter = (pIntercept->m_EnqueueCounter).super___atomic_base<unsigned_long>._M_i;
  local_68 = fill_color;
  local_60 = origin;
  getFormattedSyncPointWaitList_abi_cxx11_
            (&syncPointWaitList,pIntercept,num_sync_points_in_wait_list,sync_point_wait_list);
  if ((pIntercept->m_Config).CallLogging == true) {
    CLIntercept::callLoggingEnter
              (pIntercept,"clCommandFillImageKHR",enqueueCounter,(cl_kernel)0x0,
               "command_buffer = %p, command_queue = %p, image = %p%s",command_buffer,local_78,image
               ,syncPointWaitList._M_dataplus._M_p);
  }
  if (((pIntercept->m_Config).HostPerformanceTiming == false) &&
     ((pIntercept->m_Config).ChromeCallLogging != true)) {
    local_a0.__d.__r = (duration)0;
  }
  else {
    local_a0.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  }
  errorCode = (*pmVar4->clCommandFillImageKHR)
                        (command_buffer,local_78,local_58,image,local_68,local_60,region,
                         num_sync_points_in_wait_list,sync_point_wait_list,sync_point,mutable_handle
                        );
  pmVar4 = (mapped_type *)(ulong)errorCode;
  if (((pIntercept->m_Config).HostPerformanceTiming == false) &&
     ((pIntercept->m_Config).ChromeCallLogging != true)) {
    end.__d.__r = (duration)0;
  }
  else {
    end.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    if (((pIntercept->m_Config).HostPerformanceTiming == true) &&
       (((pIntercept->m_Config).HostPerformanceTimingMinEnqueue <= enqueueCounter &&
        (enqueueCounter <= (pIntercept->m_Config).HostPerformanceTimingMaxEnqueue)))) {
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
      CLIntercept::updateHostTimingStats(pIntercept,"clCommandFillImageKHR",&local_98,local_a0,end);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
    }
  }
  bVar2 = (pIntercept->m_Config).ErrorLogging;
  if ((bVar2 == false) && ((pIntercept->m_Config).ErrorAssert == false)) {
    if ((errorCode != 0) && ((pIntercept->m_Config).NoErrors != false)) {
LAB_00142b81:
      if (bVar2 != false) {
        CLIntercept::logError(pIntercept,"clCommandFillImageKHR",errorCode);
      }
      if ((pIntercept->m_Config).ErrorAssert == true) {
        raise(5);
      }
      if ((pIntercept->m_Config).NoErrors != false) {
        pmVar4 = (mapped_type *)0x0;
      }
    }
  }
  else {
    if (errorCode != 0) goto LAB_00142b81;
    pmVar4 = (mapped_type *)0x0;
  }
  if (((command_buffer != (cl_command_buffer_khr)0x0) && ((int)pmVar4 == 0)) &&
     ((pIntercept->m_Config).DumpCommandBuffers == true)) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
    CLIntercept::recordCommandBufferCommand
              (pIntercept,command_buffer,"clCommandFillImageKHR",&local_98,
               num_sync_points_in_wait_list,sync_point_wait_list,sync_point);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
  }
  if ((pIntercept->m_Config).CallLogging == true) {
    CLIntercept::callLoggingExit
              (pIntercept,"clCommandFillImageKHR",(int)pmVar4,(cl_event *)0x0,sync_point);
  }
  if ((pIntercept->m_Config).ChromeCallLogging == true) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
    CLIntercept::chromeCallLoggingExit
              (pIntercept,"clCommandFillImageKHR",&local_98,true,enqueueCounter,local_a0,end);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
  }
  if ((mutable_handle != (cl_mutable_command_khr *)0x0) &&
     (*mutable_handle != (cl_mutable_command_khr)0x0)) {
    CLIntercept::addMutableCommandInfo(pIntercept,*mutable_handle,command_buffer,0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)syncPointWaitList._M_dataplus._M_p != &syncPointWaitList.field_2) {
    operator_delete(syncPointWaitList._M_dataplus._M_p);
  }
LAB_00142cf2:
  if (local_70 ==
      (_func_cl_int_cl_command_buffer_khr_cl_command_queue_cl_command_properties_khr_ptr_cl_mem_void_ptr_size_t_ptr_size_t_ptr_cl_uint_cl_sync_point_khr_ptr_cl_sync_point_khr_ptr_cl_mutable_command_khr_ptr
       *)0x0) {
    return -0x472;
  }
  return (cl_int)pmVar4;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL clCommandFillImageKHR(
    cl_command_buffer_khr command_buffer,
    cl_command_queue command_queue,
    const cl_command_properties_khr* properties,
    cl_mem image,
    const void* fill_color,
    const size_t* origin,
    const size_t* region,
    cl_uint num_sync_points_in_wait_list,
    const cl_sync_point_khr* sync_point_wait_list,
    cl_sync_point_khr* sync_point,
    cl_mutable_command_khr* mutable_handle)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept )
    {
        const auto& dispatchX = pIntercept->dispatchX(command_buffer);
        if( dispatchX.clCommandFillImageKHR )
        {
            GET_ENQUEUE_COUNTER();

            const std::string syncPointWaitList = getFormattedSyncPointWaitList(
                pIntercept,
                num_sync_points_in_wait_list,
                sync_point_wait_list);

            CALL_LOGGING_ENTER(
                "command_buffer = %p, command_queue = %p, image = %p%s",
                command_buffer,
                command_queue,
                image,
                syncPointWaitList.c_str() );
            HOST_PERFORMANCE_TIMING_START();

            cl_int  retVal = dispatchX.clCommandFillImageKHR(
                command_buffer,
                command_queue,
                properties,
                image,
                fill_color,
                origin,
                region,
                num_sync_points_in_wait_list,
                sync_point_wait_list,
                sync_point,
                mutable_handle );

            HOST_PERFORMANCE_TIMING_END();
            CHECK_ERROR( retVal );
            RECORD_COMMAND_BUFFER_COMMAND(
                retVal,
                command_buffer,
                num_sync_points_in_wait_list,
                sync_point_wait_list,
                sync_point );
            CALL_LOGGING_EXIT_SYNC_POINT( retVal, sync_point );
            ADD_MUTABLE_COMMAND( mutable_handle, command_buffer );

            return retVal;
        }
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_COMMAND_BUFFER_KHR);
}